

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmstr_.c
# Opt level: O0

void lmstr_(minpack_funcderstr_mn fcnderstr_mn,int *m,int *n,double *x,double *fvec,double *fjac,
           int *ldfjac,double *ftol,double *xtol,double *gtol,int *maxfev,double *diag,int *mode,
           double *factor,int *nprint,int *info,int *nfev,int *njev,int *ipvt,double *qtf,
           double *wa1,double *wa2,double *wa3,double *wa4)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double *wa2_00;
  long in_RCX;
  int *in_RDX;
  int *in_RSI;
  code *in_RDI;
  long in_R8;
  long in_R9;
  int *pivot;
  double *rdiag;
  double dVar10;
  double *pdVar11;
  int *in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  int *in_stack_00000028;
  long in_stack_00000030;
  int *in_stack_00000038;
  double *in_stack_00000040;
  int *in_stack_00000048;
  int *in_stack_00000050;
  int *in_stack_00000058;
  int *in_stack_00000060;
  long in_stack_00000068;
  long in_stack_00000070;
  long in_stack_00000078;
  double prered;
  double epsmch;
  double dirder;
  double actred;
  double fnorm1;
  double xnorm;
  double pnorm;
  double gnorm;
  double fnorm;
  double ratio;
  double delta;
  int iflag;
  double temp2;
  double temp1;
  double temp;
  int iter;
  int sing;
  double sum;
  double par;
  int l;
  int j;
  int i__;
  double d__3;
  double d__2;
  double d__1;
  int i__2;
  int i__1;
  int fjac_offset;
  int fjac_dim1;
  int c_true;
  int c__1;
  undefined1 *puVar12;
  undefined1 *puVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *in_stack_fffffffffffffec8;
  double *in_stack_fffffffffffffed0;
  double *in_stack_fffffffffffffed8;
  double *in_stack_fffffffffffffee0;
  double *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef8;
  double *in_stack_ffffffffffffff00;
  double *in_stack_ffffffffffffff08;
  int *m_00;
  double *in_stack_ffffffffffffff20;
  double *in_stack_ffffffffffffff30;
  double *in_stack_ffffffffffffff38;
  int local_bc;
  double *local_b8;
  double *local_b0;
  double *in_stack_ffffffffffffff58;
  int iVar17;
  int iVar18;
  int *in_stack_ffffffffffffff68;
  int *ldr;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int iVar19;
  int iVar20;
  double *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int iVar21;
  int iVar22;
  undefined4 uVar23;
  int iVar24;
  
  iVar24 = 1;
  uVar23 = 1;
  m_00 = (int *)0x0;
  lVar3 = (long)epsmch + -8;
  lVar4 = (long)prered + -8;
  lVar5 = in_stack_00000078 + -8;
  lVar6 = in_stack_00000070 + -8;
  lVar7 = in_stack_00000068 + -4;
  lVar8 = in_stack_00000030 + -8;
  lVar9 = in_RCX + -8;
  iVar22 = *in_stack_00000008;
  iVar2 = iVar22 + 1;
  wa2_00 = (double *)(in_R9 + (long)iVar2 * -8);
  pivot = (int *)dpmpar_((int *)&stack0xffffffffffffffb4);
  *in_stack_00000050 = 0;
  local_bc = 0;
  *in_stack_00000058 = 0;
  *in_stack_00000060 = 0;
  if ((((0 < *in_RDX) && (*in_RDX <= *in_RSI)) && (*in_RDX <= *in_stack_00000008)) &&
     (((0.0 < *in_stack_00000010 || *in_stack_00000010 == 0.0 &&
       (0.0 < *in_stack_00000018 || *in_stack_00000018 == 0.0)) &&
      ((0.0 < *in_stack_00000020 || *in_stack_00000020 == 0.0 &&
       ((0 < *in_stack_00000028 && (0.0 < *in_stack_00000040)))))))) {
    if (*in_stack_00000038 == 2) {
      for (iVar17 = 1; iVar17 <= *in_RDX; iVar17 = iVar17 + 1) {
        if (*(double *)(lVar8 + (long)iVar17 * 8) <= 0.0) goto LAB_00103839;
      }
    }
    local_bc = 1;
    (*in_RDI)(in_RSI,in_RDX,in_RCX,in_R8,epsmch,&local_bc);
    *in_stack_00000058 = 1;
    if (-1 < local_bc) {
      rdiag = (double *)enorm_((int *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      ldr = (int *)0x0;
      iVar17 = 1;
      do {
        if (0 < *in_stack_00000048) {
          local_bc = 0;
          if ((iVar17 + -1) % *in_stack_00000048 == 0) {
            (*in_RDI)(in_RSI,in_RDX,in_RCX,in_R8,epsmch,&local_bc);
          }
          if (local_bc < 0) break;
        }
        iVar21 = *in_RDX;
        for (iVar19 = 1; iVar19 <= iVar21; iVar19 = iVar19 + 1) {
          *(undefined8 *)(lVar6 + (long)iVar19 * 8) = 0;
          in_stack_ffffffffffffffa0 = *in_RDX;
          for (iVar20 = 1; iVar20 <= in_stack_ffffffffffffffa0; iVar20 = iVar20 + 1) {
            wa2_00[iVar20 + iVar19 * iVar22] = 0.0;
          }
        }
        local_bc = 2;
        iVar21 = *in_RSI;
        for (iVar19 = 1; iVar19 <= iVar21; iVar19 = iVar19 + 1) {
          (*in_RDI)(in_RSI,in_RDX,in_RCX,in_R8,epsmch,&local_bc);
          if (local_bc < 0) goto LAB_00103839;
          in_stack_ffffffffffffff58 = *(double **)(in_R8 + -8 + (long)iVar19 * 8);
          rwupdt_(pivot,in_stack_fffffffffffffee8,(int *)in_stack_fffffffffffffee0,
                  in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                  in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
          local_bc = local_bc + 1;
        }
        *in_stack_00000060 = *in_stack_00000060 + 1;
        iVar18 = 0;
        iVar21 = *in_RDX;
        for (iVar20 = 1; iVar20 <= iVar21; iVar20 = iVar20 + 1) {
          if ((wa2_00[iVar20 + iVar20 * iVar22] == 0.0) && (!NAN(wa2_00[iVar20 + iVar20 * iVar22])))
          {
            iVar18 = 1;
          }
          *(int *)(lVar7 + (long)iVar20 * 4) = iVar20;
          dVar10 = enorm_((int *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          *(double *)(lVar4 + (long)iVar20 * 8) = dVar10;
        }
        if (iVar18 != 0) {
          qrfac_(m_00,(int *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffef8,pivot,(int *)in_stack_fffffffffffffee8,
                 (int *)in_stack_ffffffffffffff20,rdiag,in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff38);
          iVar21 = *in_RDX;
          for (iVar20 = 1; iVar20 <= iVar21; iVar20 = iVar20 + 1) {
            if ((wa2_00[iVar20 + iVar20 * iVar22] != 0.0) || (NAN(wa2_00[iVar20 + iVar20 * iVar22]))
               ) {
              in_stack_ffffffffffffff68 = (int *)0x0;
              for (iVar19 = iVar20; iVar19 <= *in_RDX; iVar19 = iVar19 + 1) {
                in_stack_ffffffffffffff68 =
                     (int *)(wa2_00[iVar19 + iVar20 * iVar22] *
                             *(double *)(lVar6 + (long)iVar19 * 8) +
                            (double)in_stack_ffffffffffffff68);
              }
              in_stack_ffffffffffffff58 =
                   (double *)(-(double)in_stack_ffffffffffffff68 / wa2_00[iVar20 + iVar20 * iVar22])
              ;
              in_stack_ffffffffffffffa0 = *in_RDX;
              for (iVar19 = iVar20; iVar19 <= in_stack_ffffffffffffffa0; iVar19 = iVar19 + 1) {
                *(double *)(lVar6 + (long)iVar19 * 8) =
                     wa2_00[iVar19 + iVar20 * iVar22] * (double)in_stack_ffffffffffffff58 +
                     *(double *)(lVar6 + (long)iVar19 * 8);
              }
            }
            wa2_00[iVar20 + iVar20 * iVar22] = *(double *)(lVar5 + (long)iVar20 * 8);
          }
        }
        if (iVar17 == 1) {
          if (*in_stack_00000038 != 2) {
            iVar21 = *in_RDX;
            for (iVar20 = 1; iVar20 <= iVar21; iVar20 = iVar20 + 1) {
              *(undefined8 *)(lVar8 + (long)iVar20 * 8) = *(undefined8 *)(lVar4 + (long)iVar20 * 8);
              dVar10 = *(double *)(lVar4 + (long)iVar20 * 8);
              if ((dVar10 == 0.0) && (!NAN(dVar10))) {
                *(undefined8 *)(lVar8 + (long)iVar20 * 8) = 0x3ff0000000000000;
              }
            }
          }
          iVar21 = *in_RDX;
          for (iVar20 = 1; iVar20 <= iVar21; iVar20 = iVar20 + 1) {
            *(double *)(lVar3 + (long)iVar20 * 8) =
                 *(double *)(lVar8 + (long)iVar20 * 8) * *(double *)(lVar9 + (long)iVar20 * 8);
          }
          m_00 = (int *)enorm_((int *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          in_stack_ffffffffffffff38 = (double *)(*in_stack_00000040 * (double)m_00);
          if (((double)in_stack_ffffffffffffff38 == 0.0) &&
             (!NAN((double)in_stack_ffffffffffffff38))) {
            in_stack_ffffffffffffff38 = (double *)*in_stack_00000040;
          }
        }
        in_stack_ffffffffffffff20 = (double *)0x0;
        if (((double)rdiag != 0.0) || (NAN((double)rdiag))) {
          iVar21 = *in_RDX;
          for (iVar20 = 1; iVar20 <= iVar21; iVar20 = iVar20 + 1) {
            in_stack_ffffffffffffff7c = *(int *)(lVar7 + (long)iVar20 * 4);
            dVar10 = *(double *)(lVar4 + (long)in_stack_ffffffffffffff7c * 8);
            if ((dVar10 != 0.0) || (pdVar11 = in_stack_ffffffffffffff20, NAN(dVar10))) {
              in_stack_ffffffffffffff68 = (int *)0x0;
              for (iVar19 = 1; iVar19 <= iVar20; iVar19 = iVar19 + 1) {
                in_stack_ffffffffffffff68 =
                     (int *)(wa2_00[iVar19 + iVar20 * iVar22] *
                             (*(double *)(lVar6 + (long)iVar19 * 8) / (double)rdiag) +
                            (double)in_stack_ffffffffffffff68);
              }
              in_stack_ffffffffffffff98 =
                   (double *)
                   ((double)in_stack_ffffffffffffff68 /
                   *(double *)(lVar4 + (long)in_stack_ffffffffffffff7c * 8));
              in_stack_fffffffffffffee0 = in_stack_ffffffffffffff98;
              if ((double)in_stack_ffffffffffffff98 < 0.0) {
                in_stack_fffffffffffffee0 = (double *)-(double)in_stack_ffffffffffffff98;
              }
              in_stack_fffffffffffffed8 = in_stack_fffffffffffffee0;
              pdVar11 = in_stack_fffffffffffffee0;
              in_stack_ffffffffffffff90 = in_stack_ffffffffffffff20;
              in_stack_ffffffffffffffa0 = iVar20;
              if ((double)in_stack_fffffffffffffee0 <= (double)in_stack_ffffffffffffff20) {
                in_stack_fffffffffffffed8 = in_stack_ffffffffffffff20;
                pdVar11 = in_stack_ffffffffffffff20;
              }
            }
            in_stack_ffffffffffffff20 = pdVar11;
          }
        }
        if ((double)in_stack_ffffffffffffff20 <= *in_stack_00000020) {
          *in_stack_00000050 = 4;
        }
        if (*in_stack_00000050 != 0) break;
        if (*in_stack_00000038 != 2) {
          iVar21 = *in_RDX;
          for (iVar20 = 1; iVar20 <= iVar21; iVar20 = iVar20 + 1) {
            in_stack_ffffffffffffff98 = *(double **)(lVar8 + (long)iVar20 * 8);
            in_stack_ffffffffffffff90 = *(double **)(lVar4 + (long)iVar20 * 8);
            in_stack_fffffffffffffed0 = in_stack_ffffffffffffff90;
            if ((double)in_stack_ffffffffffffff90 <= (double)in_stack_ffffffffffffff98) {
              in_stack_fffffffffffffed0 = in_stack_ffffffffffffff98;
            }
            *(double **)(lVar8 + (long)iVar20 * 8) = in_stack_fffffffffffffed0;
          }
        }
        do {
          puVar12 = &stack0xffffffffffffff38;
          puVar13 = &stack0xffffffffffffff70;
          lVar14 = in_stack_00000078;
          dVar10 = prered;
          dVar15 = epsmch;
          dVar16 = dirder;
          lmpar_((int *)CONCAT44(iVar19,iVar20),
                 (double *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),ldr,
                 in_stack_ffffffffffffff68,(double *)CONCAT44(iVar18,iVar17),
                 in_stack_ffffffffffffff58,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                 (double *)CONCAT44(iVar21,in_stack_ffffffffffffffa0),
                 (double *)CONCAT44(iVar22,iVar2),(double *)CONCAT44(iVar24,uVar23),wa2_00);
          iVar21 = *in_RDX;
          for (iVar20 = 1; iVar20 <= iVar21; iVar20 = iVar20 + 1) {
            *(ulong *)(lVar5 + (long)iVar20 * 8) =
                 *(ulong *)(lVar5 + (long)iVar20 * 8) ^ 0x8000000000000000;
            *(double *)(lVar4 + (long)iVar20 * 8) =
                 *(double *)(lVar9 + (long)iVar20 * 8) + *(double *)(lVar5 + (long)iVar20 * 8);
            *(double *)(lVar3 + (long)iVar20 * 8) =
                 *(double *)(lVar8 + (long)iVar20 * 8) * *(double *)(lVar5 + (long)iVar20 * 8);
          }
          pdVar11 = (double *)enorm_((int *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          in_stack_ffffffffffffff98 = in_stack_ffffffffffffff38;
          if ((iVar17 == 1) &&
             (in_stack_fffffffffffffec8 = pdVar11, in_stack_ffffffffffffff98 = pdVar11,
             (double)in_stack_ffffffffffffff38 <= (double)pdVar11)) {
            in_stack_fffffffffffffec8 = in_stack_ffffffffffffff38;
            in_stack_ffffffffffffff98 = in_stack_ffffffffffffff38;
          }
          local_bc = 1;
          (*in_RDI)(in_RSI,in_RDX,prered,dirder,epsmch,&local_bc,puVar12,puVar13,lVar14,dVar10,
                    dVar15,dVar16);
          *in_stack_00000058 = *in_stack_00000058 + 1;
          if (local_bc < 0) goto LAB_00103839;
          in_stack_ffffffffffffff08 =
               (double *)enorm_((int *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          in_stack_ffffffffffffff00 = (double *)0xbff0000000000000;
          if ((double)in_stack_ffffffffffffff08 * 0.1 < (double)rdiag) {
            in_stack_ffffffffffffff00 =
                 (double *)
                 (-((double)in_stack_ffffffffffffff08 / (double)rdiag) *
                  ((double)in_stack_ffffffffffffff08 / (double)rdiag) + 1.0);
          }
          iVar21 = *in_RDX;
          iVar1 = 1;
          while (iVar20 = iVar1, iVar20 <= iVar21) {
            *(undefined8 *)(lVar3 + (long)iVar20 * 8) = 0;
            in_stack_ffffffffffffff7c = *(int *)(lVar7 + (long)iVar20 * 4);
            in_stack_ffffffffffffff58 = *(double **)(lVar5 + (long)in_stack_ffffffffffffff7c * 8);
            for (iVar19 = 1; iVar19 <= iVar20; iVar19 = iVar19 + 1) {
              *(double *)(lVar3 + (long)iVar19 * 8) =
                   wa2_00[iVar19 + iVar20 * iVar22] * (double)in_stack_ffffffffffffff58 +
                   *(double *)(lVar3 + (long)iVar19 * 8);
            }
            in_stack_ffffffffffffffa0 = iVar20;
            iVar1 = iVar20 + 1;
          }
          dVar10 = enorm_((int *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          local_b0 = (double *)(dVar10 / (double)rdiag);
          dVar10 = sqrt((double)ldr);
          local_b8 = (double *)((dVar10 * (double)pdVar11) / (double)rdiag);
          in_stack_fffffffffffffee8 =
               (double *)
               ((double)local_b0 * (double)local_b0 + ((double)local_b8 * (double)local_b8) / 0.5);
          in_stack_fffffffffffffef8 =
               (int *)-((double)local_b0 * (double)local_b0 + (double)local_b8 * (double)local_b8);
          in_stack_ffffffffffffff30 = (double *)0x0;
          if (((double)in_stack_fffffffffffffee8 != 0.0) || (NAN((double)in_stack_fffffffffffffee8))
             ) {
            in_stack_ffffffffffffff30 =
                 (double *)((double)in_stack_ffffffffffffff00 / (double)in_stack_fffffffffffffee8);
          }
          if ((double)in_stack_ffffffffffffff30 <= 0.25) {
            if (0.0 <= (double)in_stack_ffffffffffffff00) {
              in_stack_ffffffffffffff58 = (double *)0x3fe0000000000000;
            }
            else {
              in_stack_ffffffffffffff58 =
                   (double *)
                   (((double)in_stack_fffffffffffffef8 * 0.5) /
                   ((double)in_stack_ffffffffffffff00 * 0.5 + (double)in_stack_fffffffffffffef8));
            }
            if (((double)rdiag <= (double)in_stack_ffffffffffffff08 * 0.1) ||
               ((double)in_stack_ffffffffffffff58 < 0.1)) {
              in_stack_ffffffffffffff58 = (double *)0x3fb999999999999a;
            }
            in_stack_ffffffffffffff90 = (double *)((double)pdVar11 / 0.1);
            local_148 = in_stack_ffffffffffffff90;
            if ((double)in_stack_ffffffffffffff98 <= (double)in_stack_ffffffffffffff90) {
              local_148 = in_stack_ffffffffffffff98;
            }
            ldr = (int *)((double)ldr / (double)in_stack_ffffffffffffff58);
            in_stack_ffffffffffffff38 =
                 (double *)((double)in_stack_ffffffffffffff58 * (double)local_148);
          }
          else {
            in_stack_ffffffffffffff90 = local_b8;
            if ((((double)ldr == 0.0) && (!NAN((double)ldr))) ||
               (in_stack_ffffffffffffff38 = in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff98 = local_b0, 0.75 <= (double)in_stack_ffffffffffffff30)) {
              ldr = (int *)((double)ldr * 0.5);
              in_stack_ffffffffffffff38 = (double *)((double)pdVar11 / 0.5);
              in_stack_ffffffffffffff98 = local_b0;
            }
          }
          if (0.0001 <= (double)in_stack_ffffffffffffff30) {
            iVar21 = *in_RDX;
            for (iVar20 = 1; iVar20 <= iVar21; iVar20 = iVar20 + 1) {
              *(undefined8 *)(lVar9 + (long)iVar20 * 8) = *(undefined8 *)(lVar4 + (long)iVar20 * 8);
              *(double *)(lVar4 + (long)iVar20 * 8) =
                   *(double *)(lVar8 + (long)iVar20 * 8) * *(double *)(lVar9 + (long)iVar20 * 8);
            }
            iVar21 = *in_RSI;
            for (iVar19 = 1; iVar19 <= iVar21; iVar19 = iVar19 + 1) {
              *(undefined8 *)(in_R8 + -8 + (long)iVar19 * 8) =
                   *(undefined8 *)((long)dirder + -8 + (long)iVar19 * 8);
            }
            m_00 = (int *)enorm_((int *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
            iVar17 = iVar17 + 1;
            rdiag = in_stack_ffffffffffffff08;
          }
          local_150 = in_stack_ffffffffffffff00;
          if ((double)in_stack_ffffffffffffff00 < 0.0) {
            local_150 = (double *)((ulong)in_stack_ffffffffffffff00 ^ 0x8000000000000000);
          }
          if ((((double)local_150 <= *in_stack_00000010) &&
              ((double)in_stack_fffffffffffffee8 <= *in_stack_00000010)) &&
             ((double)in_stack_ffffffffffffff30 * 0.5 <= 1.0)) {
            *in_stack_00000050 = 1;
          }
          if ((double)in_stack_ffffffffffffff38 <= *in_stack_00000018 * (double)m_00) {
            *in_stack_00000050 = 2;
          }
          local_158 = in_stack_ffffffffffffff00;
          if ((double)in_stack_ffffffffffffff00 < 0.0) {
            local_158 = (double *)((ulong)in_stack_ffffffffffffff00 ^ 0x8000000000000000);
          }
          if ((((double)local_158 <= *in_stack_00000010) &&
              ((double)in_stack_fffffffffffffee8 <= *in_stack_00000010)) &&
             (((double)in_stack_ffffffffffffff30 * 0.5 <= 1.0 && (*in_stack_00000050 == 2)))) {
            *in_stack_00000050 = 3;
          }
          if (*in_stack_00000050 != 0) goto LAB_00103839;
          if (*in_stack_00000028 <= *in_stack_00000058) {
            *in_stack_00000050 = 5;
          }
          local_160 = in_stack_ffffffffffffff00;
          if ((double)in_stack_ffffffffffffff00 < 0.0) {
            local_160 = (double *)((ulong)in_stack_ffffffffffffff00 ^ 0x8000000000000000);
          }
          if ((((double)local_160 <= (double)pivot) &&
              ((double)in_stack_fffffffffffffee8 <= (double)pivot)) &&
             ((double)in_stack_ffffffffffffff30 * 0.5 <= 1.0)) {
            *in_stack_00000050 = 6;
          }
          if ((double)in_stack_ffffffffffffff38 <= (double)pivot * (double)m_00) {
            *in_stack_00000050 = 7;
          }
          if ((double)in_stack_ffffffffffffff20 <= (double)pivot) {
            *in_stack_00000050 = 8;
          }
          if (*in_stack_00000050 != 0) goto LAB_00103839;
        } while ((double)in_stack_ffffffffffffff30 < 0.0001);
      } while( true );
    }
  }
LAB_00103839:
  if (local_bc < 0) {
    *in_stack_00000050 = local_bc;
  }
  local_bc = 0;
  if (0 < *in_stack_00000048) {
    (*in_RDI)(in_RSI,in_RDX,in_RCX,in_R8,epsmch,&local_bc);
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(lmstr)(__minpack_decl_fcnderstr_mn__ const int *m, const int *n, real *x, 
	real *fvec, real *fjac, const int *ldfjac, const real *ftol,
	const real *xtol, const real *gtol, const int *maxfev, real *
	diag, const int *mode, const real *factor, const int *nprint, int *
	info, int *nfev, int *njev, int *ipvt, real *qtf, 
	real *wa1, real *wa2, real *wa3, real *wa4)
{
    /* Table of constant values */

    const int c__1 = 1;
    const int c_true = TRUE_;

    /* Initialized data */

#define p1 ((real).1)
#define p5 ((real).5)
#define p25 ((real).25)
#define p75 .75
#define p0001 1e-4

    /* System generated locals */
    int fjac_dim1, fjac_offset, i__1, i__2;
    real d__1, d__2, d__3;

    /* Local variables */
    int i__, j, l;
    real par, sum;
    int sing;
    int iter;
    real temp, temp1, temp2;
    int iflag;
    real delta;
    real ratio;
    real fnorm, gnorm, pnorm, xnorm = 0, fnorm1, actred, dirder, 
	    epsmch, prered;

/*     ********** */

/*     subroutine lmstr */

/*     the purpose of lmstr is to minimize the sum of the squares of */
/*     m nonlinear functions in n variables by a modification of */
/*     the levenberg-marquardt algorithm which uses minimal storage. */
/*     the user must provide a subroutine which calculates the */
/*     functions and the rows of the jacobian. */

/*     the subroutine statement is */

/*       subroutine lmstr(fcn,m,n,x,fvec,fjac,ldfjac,ftol,xtol,gtol, */
/*                        maxfev,diag,mode,factor,nprint,info,nfev, */
/*                        njev,ipvt,qtf,wa1,wa2,wa3,wa4) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions and the rows of the jacobian. */
/*         fcn must be declared in an external statement in the */
/*         user calling program, and should be written as follows. */

/*         subroutine fcn(m,n,x,fvec,fjrow,iflag) */
/*         integer m,n,iflag */
/*         double precision x(n),fvec(m),fjrow(n) */
/*         ---------- */
/*         if iflag = 1 calculate the functions at x and */
/*         return this vector in fvec. */
/*         if iflag = i calculate the (i-1)-st row of the */
/*         jacobian at x and return this vector in fjrow. */
/*         ---------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of lmstr. */
/*         in this case set iflag to a negative integer. */

/*       m is a positive integer input variable set to the number */
/*         of functions. */

/*       n is a positive integer input variable set to the number */
/*         of variables. n must not exceed m. */

/*       x is an array of length n. on input x must contain */
/*         an initial estimate of the solution vector. on output x */
/*         contains the final estimate of the solution vector. */

/*       fvec is an output array of length m which contains */
/*         the functions evaluated at the output x. */

/*       fjac is an output n by n array. the upper triangle of fjac */
/*         contains an upper triangular matrix r such that */

/*                t     t           t */
/*               p *(jac *jac)*p = r *r, */

/*         where p is a permutation matrix and jac is the final */
/*         calculated jacobian. column j of p is column ipvt(j) */
/*         (see below) of the identity matrix. the lower triangular */
/*         part of fjac contains information generated during */
/*         the computation of r. */

/*       ldfjac is a positive integer input variable not less than n */
/*         which specifies the leading dimension of the array fjac. */

/*       ftol is a nonnegative input variable. termination */
/*         occurs when both the actual and predicted relative */
/*         reductions in the sum of squares are at most ftol. */
/*         therefore, ftol measures the relative error desired */
/*         in the sum of squares. */

/*       xtol is a nonnegative input variable. termination */
/*         occurs when the relative error between two consecutive */
/*         iterates is at most xtol. therefore, xtol measures the */
/*         relative error desired in the approximate solution. */

/*       gtol is a nonnegative input variable. termination */
/*         occurs when the cosine of the angle between fvec and */
/*         any column of the jacobian is at most gtol in absolute */
/*         value. therefore, gtol measures the orthogonality */
/*         desired between the function vector and the columns */
/*         of the jacobian. */

/*       maxfev is a positive integer input variable. termination */
/*         occurs when the number of calls to fcn with iflag = 1 */
/*         has reached maxfev. */

/*       diag is an array of length n. if mode = 1 (see */
/*         below), diag is internally set. if mode = 2, diag */
/*         must contain positive entries that serve as */
/*         multiplicative scale factors for the variables. */

/*       mode is an integer input variable. if mode = 1, the */
/*         variables will be scaled internally. if mode = 2, */
/*         the scaling is specified by the input diag. other */
/*         values of mode are equivalent to mode = 1. */

/*       factor is a positive input variable used in determining the */
/*         initial step bound. this bound is set to the product of */
/*         factor and the euclidean norm of diag*x if nonzero, or else */
/*         to factor itself. in most cases factor should lie in the */
/*         interval (.1,100.). 100. is a generally recommended value. */

/*       nprint is an integer input variable that enables controlled */
/*         printing of iterates if it is positive. in this case, */
/*         fcn is called with iflag = 0 at the beginning of the first */
/*         iteration and every nprint iterations thereafter and */
/*         immediately prior to return, with x and fvec available */
/*         for printing. if nprint is not positive, no special calls */
/*         of fcn with iflag = 0 are made. */

/*       info is an integer output variable. if the user has */
/*         terminated execution, info is set to the (negative) */
/*         value of iflag. see description of fcn. otherwise, */
/*         info is set as follows. */

/*         info = 0  improper input parameters. */

/*         info = 1  both actual and predicted relative reductions */
/*                   in the sum of squares are at most ftol. */

/*         info = 2  relative error between two consecutive iterates */
/*                   is at most xtol. */

/*         info = 3  conditions for info = 1 and info = 2 both hold. */

/*         info = 4  the cosine of the angle between fvec and any */
/*                   column of the jacobian is at most gtol in */
/*                   absolute value. */

/*         info = 5  number of calls to fcn with iflag = 1 has */
/*                   reached maxfev. */

/*         info = 6  ftol is too small. no further reduction in */
/*                   the sum of squares is possible. */

/*         info = 7  xtol is too small. no further improvement in */
/*                   the approximate solution x is possible. */

/*         info = 8  gtol is too small. fvec is orthogonal to the */
/*                   columns of the jacobian to machine precision. */

/*       nfev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 1. */

/*       njev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 2. */

/*       ipvt is an integer output array of length n. ipvt */
/*         defines a permutation matrix p such that jac*p = q*r, */
/*         where jac is the final calculated jacobian, q is */
/*         orthogonal (not stored), and r is upper triangular. */
/*         column j of p is column ipvt(j) of the identity matrix. */

/*       qtf is an output array of length n which contains */
/*         the first n elements of the vector (q transpose)*fvec. */

/*       wa1, wa2, and wa3 are work arrays of length n. */

/*       wa4 is a work array of length m. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dpmpar,enorm,lmpar,qrfac,rwupdt */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt,mod */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, dudley v. goetschel, kenneth e. hillstrom, */
/*     jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa4;
    --fvec;
    --wa3;
    --wa2;
    --wa1;
    --qtf;
    --ipvt;
    --diag;
    --x;
    fjac_dim1 = *ldfjac;
    fjac_offset = 1 + fjac_dim1 * 1;
    fjac -= fjac_offset;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

    *info = 0;
    iflag = 0;
    *nfev = 0;
    *njev = 0;

/*     check the input parameters for errors. */

    if (*n <= 0 || *m < *n || *ldfjac < *n || *ftol < 0. || *xtol < 0. || 
	    *gtol < 0. || *maxfev <= 0 || *factor <= 0.) {
	goto L340;
    }
    if (*mode != 2) {
	goto L20;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (diag[j] <= 0.) {
	    goto L340;
	}
/* L10: */
    }
L20:

/*     evaluate the function at the starting point */
/*     and calculate its norm. */

    iflag = 1;
    fcnderstr_mn(m, n, &x[1], &fvec[1], &wa3[1], &iflag);
    *nfev = 1;
    if (iflag < 0) {
	goto L340;
    }
    fnorm = __minpack_func__(enorm)(m, &fvec[1]);

/*     initialize levenberg-marquardt parameter and iteration counter. */

    par = 0.;
    iter = 1;

/*     beginning of the outer loop. */

L30:

/*        if requested, call fcn to enable printing of iterates. */

    if (*nprint <= 0) {
	goto L40;
    }
    iflag = 0;
    if ((iter - 1) % *nprint == 0) {
	fcnderstr_mn(m, n, &x[1], &fvec[1], &wa3[1], &iflag);
    }
    if (iflag < 0) {
	goto L340;
    }
L40:

/*        compute the qr factorization of the jacobian matrix */
/*        calculated one row at a time, while simultaneously */
/*        forming (q transpose)*fvec and storing the first */
/*        n components in qtf. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	qtf[j] = 0.;
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    fjac[i__ + j * fjac_dim1] = 0.;
/* L50: */
	}
/* L60: */
    }
    iflag = 2;
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	fcnderstr_mn(m, n, &x[1], &fvec[1], &wa3[1], &iflag);
	if (iflag < 0) {
	    goto L340;
	}
	temp = fvec[i__];
	__minpack_func__(rwupdt)(n, &fjac[fjac_offset], ldfjac, &wa3[1], &qtf[1], &temp, &wa1[
		1], &wa2[1]);
	++iflag;
/* L70: */
    }
    ++(*njev);

/*        if the jacobian is rank deficient, call qrfac to */
/*        reorder its columns and update the components of qtf. */

    sing = FALSE_;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (fjac[j + j * fjac_dim1] == 0.) {
	    sing = TRUE_;
	}
	ipvt[j] = j;
	wa2[j] = __minpack_func__(enorm)(&j, &fjac[j * fjac_dim1 + 1]);
/* L80: */
    }
    if (! sing) {
	goto L130;
    }
    __minpack_func__(qrfac)(n, n, &fjac[fjac_offset], ldfjac, &c_true, &ipvt[1], n, &wa1[1], &
	    wa2[1], &wa3[1]);
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (fjac[j + j * fjac_dim1] == 0.) {
	    goto L110;
	}
	sum = 0.;
	i__2 = *n;
	for (i__ = j; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * qtf[i__];
/* L90: */
	}
	temp = -sum / fjac[j + j * fjac_dim1];
	i__2 = *n;
	for (i__ = j; i__ <= i__2; ++i__) {
	    qtf[i__] += fjac[i__ + j * fjac_dim1] * temp;
/* L100: */
	}
L110:
	fjac[j + j * fjac_dim1] = wa1[j];
/* L120: */
    }
L130:

/*        on the first iteration and if mode is 1, scale according */
/*        to the norms of the columns of the initial jacobian. */

    if (iter != 1) {
	goto L170;
    }
    if (*mode == 2) {
	goto L150;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	diag[j] = wa2[j];
	if (wa2[j] == 0.) {
	    diag[j] = 1.;
	}
/* L140: */
    }
L150:

/*        on the first iteration, calculate the norm of the scaled x */
/*        and initialize the step bound delta. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa3[j] = diag[j] * x[j];
/* L160: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa3[1]);
    delta = *factor * xnorm;
    if (delta == 0.) {
	delta = *factor;
    }
L170:

/*        compute the norm of the scaled gradient. */

    gnorm = 0.;
    if (fnorm == 0.) {
	goto L210;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = ipvt[j];
	if (wa2[l] == 0.) {
	    goto L190;
	}
	sum = 0.;
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * (qtf[i__] / fnorm);
/* L180: */
	}
/* Computing MAX */
	d__2 = gnorm, d__3 = (d__1 = sum / wa2[l], abs(d__1));
	gnorm = max(d__2,d__3);
L190:
/* L200: */
	;
    }
L210:

/*        test for convergence of the gradient norm. */

    if (gnorm <= *gtol) {
	*info = 4;
    }
    if (*info != 0) {
	goto L340;
    }

/*        rescale if necessary. */

    if (*mode == 2) {
	goto L230;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/* Computing MAX */
	d__1 = diag[j], d__2 = wa2[j];
	diag[j] = max(d__1,d__2);
/* L220: */
    }
L230:

/*        beginning of the inner loop. */

L240:

/*           determine the levenberg-marquardt parameter. */

    __minpack_func__(lmpar)(n, &fjac[fjac_offset], ldfjac, &ipvt[1], &diag[1], &qtf[1], &delta,
	     &par, &wa1[1], &wa2[1], &wa3[1], &wa4[1]);

/*           store the direction p and x + p. calculate the norm of p. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa1[j] = -wa1[j];
	wa2[j] = x[j] + wa1[j];
	wa3[j] = diag[j] * wa1[j];
/* L250: */
    }
    pnorm = __minpack_func__(enorm)(n, &wa3[1]);

/*           on the first iteration, adjust the initial step bound. */

    if (iter == 1) {
	delta = min(delta,pnorm);
    }

/*           evaluate the function at x + p and calculate its norm. */

    iflag = 1;
    fcnderstr_mn(m, n, &wa2[1], &wa4[1], &wa3[1], &iflag);
    ++(*nfev);
    if (iflag < 0) {
	goto L340;
    }
    fnorm1 = __minpack_func__(enorm)(m, &wa4[1]);

/*           compute the scaled actual reduction. */

    actred = -1.;
    if (p1 * fnorm1 < fnorm) {
/* Computing 2nd power */
	d__1 = fnorm1 / fnorm;
	actred = 1 - d__1 * d__1;
    }

/*           compute the scaled predicted reduction and */
/*           the scaled directional derivative. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa3[j] = 0.;
	l = ipvt[j];
	temp = wa1[l];
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    wa3[i__] += fjac[i__ + j * fjac_dim1] * temp;
/* L260: */
	}
/* L270: */
    }
    temp1 = __minpack_func__(enorm)(n, &wa3[1]) / fnorm;
    temp2 = sqrt(par) * pnorm / fnorm;
/* Computing 2nd power */
    d__1 = temp1;
/* Computing 2nd power */
    d__2 = temp2;
    prered = d__1 * d__1 + d__2 * d__2 / p5;
/* Computing 2nd power */
    d__1 = temp1;
/* Computing 2nd power */
    d__2 = temp2;
    dirder = -(d__1 * d__1 + d__2 * d__2);

/*           compute the ratio of the actual to the predicted */
/*           reduction. */

    ratio = 0.;
    if (prered != 0.) {
	ratio = actred / prered;
    }

/*           update the step bound. */

    if (ratio > p25) {
	goto L280;
    }
    if (actred >= 0.) {
	temp = p5;
    }
    if (actred < 0.) {
	temp = p5 * dirder / (dirder + p5 * actred);
    }
    if (p1 * fnorm1 >= fnorm || temp < p1) {
	temp = p1;
    }
/* Computing MIN */
    d__1 = delta, d__2 = pnorm / p1;
    delta = temp * min(d__1,d__2);
    par /= temp;
    goto L300;
L280:
    if (par != 0. && ratio < p75) {
	goto L290;
    }
    delta = pnorm / p5;
    par = p5 * par;
L290:
L300:

/*           test for successful iteration. */

    if (ratio < p0001) {
	goto L330;
    }

/*           successful iteration. update x, fvec, and their norms. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	x[j] = wa2[j];
	wa2[j] = diag[j] * x[j];
/* L310: */
    }
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	fvec[i__] = wa4[i__];
/* L320: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa2[1]);
    fnorm = fnorm1;
    ++iter;
L330:

/*           tests for convergence. */

    if (abs(actred) <= *ftol && prered <= *ftol && p5 * ratio <= 1.) {
	*info = 1;
    }
    if (delta <= *xtol * xnorm) {
	*info = 2;
    }
    if (abs(actred) <= *ftol && prered <= *ftol && p5 * ratio <= 1. && *info 
	    == 2) {
	*info = 3;
    }
    if (*info != 0) {
	goto L340;
    }

/*           tests for termination and stringent tolerances. */

    if (*nfev >= *maxfev) {
	*info = 5;
    }
    if (abs(actred) <= epsmch && prered <= epsmch && p5 * ratio <= 1.) {
	*info = 6;
    }
    if (delta <= epsmch * xnorm) {
	*info = 7;
    }
    if (gnorm <= epsmch) {
	*info = 8;
    }
    if (*info != 0) {
	goto L340;
    }

/*           end of the inner loop. repeat if iteration unsuccessful. */

    if (ratio < p0001) {
	goto L240;
    }

/*        end of the outer loop. */

    goto L30;
L340:

/*     termination, either normal or user imposed. */

    if (iflag < 0) {
	*info = iflag;
    }
    iflag = 0;
    if (*nprint > 0) {
	fcnderstr_mn(m, n, &x[1], &fvec[1], &wa3[1], &iflag);
    }
    return;

/*     last card of subroutine lmstr. */

}